

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::StorageImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  ulong uVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 resolveBuffer [8];
  bool bVar9;
  bool bVar10;
  int iVar11;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TestLog *pTVar12;
  TextureFormat format;
  long *plVar13;
  ulong uVar14;
  size_type *psVar15;
  ConstPixelBufferAccess *pCVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar17;
  VkDeviceSize bufferSize;
  int iVar18;
  int iVar19;
  int z;
  int local_6bc;
  int local_69c;
  LogImageSet local_690;
  string imageName;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  ConstPixelBufferAccess referenceImage;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_530;
  VkBuffer local_518;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_510;
  LogImage local_4f8;
  ConstPixelBufferAccess local_468;
  ConstPixelBufferAccess local_440;
  ConstPixelBufferAccess layeredImageTwo;
  PixelBufferAccess layeredImageOne;
  VkBufferCreateInfo bufferCreateInfo;
  ios_base local_358 [8];
  ios_base local_350 [264];
  Vec4 local_248;
  Vec4 local_238;
  ConstPixelBufferAccess actualImage;
  PixelBufferAccess errorMask;
  undefined1 local_1d8 [8];
  DeviceInterface *pDStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  TextureLevel errorMaskStorage;
  
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  allocator = Context::getDefaultAllocator(context);
  checkImageFormatRequirements(vki,physDevice,caseDef->numSamples,caseDef->colorFormat,0x18);
  pTVar12 = context->m_testCtx->m_log;
  local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"Description","");
  referenceImage.m_format = (TextureFormat)(referenceImage.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&referenceImage,"");
  tcu::LogSection::LogSection((LogSection *)&local_4f8,&local_690.m_name,(string *)&referenceImage);
  tcu::TestLog::startSection
            (pTVar12,local_4f8.m_name._M_dataplus._M_p,local_4f8.m_description._M_dataplus._M_p);
  local_1d8 = (undefined1  [8])pTVar12;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pDStack_1d0,
             "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite."
             ,0x74);
  bufferCreateInfo._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ppvVar2 = &bufferCreateInfo.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppvVar2,
             "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)."
             ,0x72);
  pTVar12 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&bufferCreateInfo,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection(pTVar12);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
  std::ios_base::~ios_base(local_350);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_1d0);
  std::ios_base::~ios_base(local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_description._M_dataplus._M_p != &local_4f8.m_description.field_2) {
    operator_delete(local_4f8.m_description._M_dataplus._M_p,
                    local_4f8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
    operator_delete(local_4f8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4f8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_4f8.m_name.field_2._M_local_buf[6],
                                      CONCAT24(local_4f8.m_name.field_2._M_allocated_capacity._4_2_,
                                               local_4f8.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if (referenceImage.m_format != (TextureFormat)(referenceImage.m_size.m_data + 2)) {
    operator_delete((void *)referenceImage.m_format,referenceImage._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    CONCAT17(local_690.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_690.m_name.field_2._M_local_buf[6],
                                      CONCAT24(local_690.m_name.field_2._M_allocated_capacity._4_2_,
                                               local_690.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  iVar19 = (caseDef->renderSize).m_data[1];
  iVar18 = (caseDef->renderSize).m_data[0];
  iVar17 = caseDef->numLayers;
  format = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar11 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar11 * iVar19 * iVar18 * iVar17);
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1d8,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_518.m_internal = (deUint64)local_1d8;
  DStack_510.m_deviceIface = pDStack_1d0;
  DStack_510.m_device = (VkDevice)local_1c8._M_allocated_capacity;
  DStack_510.m_allocator = (VkAllocationCallbacks *)local_1c8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)local_1d8,(MemoryRequirement)0x1);
  uVar7 = bufferCreateInfo._0_8_;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1d8,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  resolveBuffer = local_1d8;
  DStack_530.m_deviceIface = pDStack_1d0;
  DStack_530.m_device = (VkDevice)local_1c8._M_allocated_capacity;
  DStack_530.m_allocator = (VkAllocationCallbacks *)local_1c8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)local_1d8,(MemoryRequirement)0x1);
  uVar8 = bufferCreateInfo._0_8_;
  memset(*(void **)(uVar7 + 0x18),0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar7 + 8),*(VkDeviceSize *)(uVar7 + 0x10),
             bufferSize);
  memset(*(void **)(uVar8 + 0x18),0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),
             bufferSize);
  renderAndResolve(context,caseDef,local_518,false);
  renderAndResolve(context,caseDef,(VkBuffer)resolveBuffer,true);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar7 + 8),*(VkDeviceSize *)(uVar7 + 0x10),
             bufferSize);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),
             bufferSize);
  bufferCreateInfo._0_8_ = ::vk::mapVkFormat(caseDef->colorFormat);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&layeredImageOne,(TextureFormat *)&bufferCreateInfo,(caseDef->renderSize).m_data[0],
             (caseDef->renderSize).m_data[1],caseDef->numLayers,*(void **)(uVar7 + 0x18));
  bufferCreateInfo._0_8_ = ::vk::mapVkFormat(caseDef->colorFormat);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&layeredImageTwo,(TextureFormat *)&bufferCreateInfo,(caseDef->renderSize).m_data[0],
             (caseDef->renderSize).m_data[1],caseDef->numLayers,*(void **)(uVar8 + 0x18));
  pTVar12 = context->m_testCtx->m_log;
  local_440.m_format = layeredImageOne.super_ConstPixelBufferAccess.m_format;
  local_440.m_size.m_data[0] = layeredImageOne.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_440.m_size.m_data[1] = layeredImageOne.super_ConstPixelBufferAccess.m_size.m_data[1];
  local_440.m_size.m_data[2] = layeredImageOne.super_ConstPixelBufferAccess.m_size.m_data[2];
  local_440.m_pitch.m_data[0] = layeredImageOne.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  local_440.m_pitch.m_data[1] = layeredImageOne.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  local_440.m_pitch.m_data[2] = layeredImageOne.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  local_440.m_data = layeredImageOne.super_ConstPixelBufferAccess.m_data;
  local_468.m_format = layeredImageTwo.m_format;
  local_468.m_size.m_data[0] = layeredImageTwo.m_size.m_data[0];
  local_468.m_size.m_data[1] = layeredImageTwo.m_size.m_data[1];
  local_468.m_size.m_data[2] = layeredImageTwo.m_size.m_data[2];
  local_468.m_pitch.m_data[2] = layeredImageTwo.m_pitch.m_data[2];
  local_468.m_pitch.m_data[0] = layeredImageTwo.m_pitch.m_data[0];
  local_468.m_pitch.m_data[1] = layeredImageTwo.m_pitch.m_data[1];
  local_468.m_data = layeredImageTwo.m_data;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 1.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[3] = 1.0;
  local_248.m_data[0] = 1.0;
  local_248.m_data[1] = 0.0;
  local_248.m_data[2] = 0.0;
  local_248.m_data[3] = 1.0;
  bVar9 = ::vk::isIntFormat(caseDef->colorFormat);
  if (!bVar9) {
    bVar10 = ::vk::isUintFormat(caseDef->colorFormat);
    bVar9 = false;
    local_69c = 0;
    if (!bVar10) goto LAB_004c4667;
  }
  local_69c = (caseDef->renderSize).m_data[0] * 2;
  bVar9 = true;
LAB_004c4667:
  iVar19 = caseDef->numLayers;
  if (iVar19 < 1) {
    local_6bc = 0;
  }
  else {
    local_6bc = 0;
    iVar18 = 0;
    do {
      tcu::getSubregion(&referenceImage,&local_440,0,0,iVar18,(caseDef->renderSize).m_data[0],
                        (caseDef->renderSize).m_data[1],1);
      tcu::getSubregion(&actualImage,&local_468,0,0,iVar18,(caseDef->renderSize).m_data[0],
                        (caseDef->renderSize).m_data[1],1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferCreateInfo);
      std::ostream::operator<<((LogImage *)&bufferCreateInfo,iVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferCreateInfo);
      std::ios_base::~ios_base(local_358);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0xaba1f6);
      imageName._M_dataplus._M_p = (pointer)&imageName.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        imageName.field_2._M_allocated_capacity = *psVar15;
        imageName.field_2._8_8_ = plVar13[3];
      }
      else {
        imageName.field_2._M_allocated_capacity = *psVar15;
        imageName._M_dataplus._M_p = (pointer)*plVar13;
      }
      imageName._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,(ulong)(local_1c8._M_allocated_capacity + 1));
      }
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
      bufferCreateInfo._4_4_ = 3;
      tcu::TextureLevel::TextureLevel
                (&errorMaskStorage,(TextureFormat *)&bufferCreateInfo,
                 (caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1);
      tcu::TextureLevel::getAccess(&errorMask,&errorMaskStorage);
      iVar19 = (caseDef->renderSize).m_data[1];
      if (iVar19 < 1) {
        iVar17 = 0;
      }
      else {
        iVar11 = (caseDef->renderSize).m_data[0];
        z = 0;
        iVar17 = 0;
        do {
          if (0 < iVar11) {
            iVar19 = 0;
            do {
              if (bVar9) {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&bufferCreateInfo,(int)&referenceImage,iVar19,z
                          );
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_1d8,(int)&actualImage,iVar19,z);
                if (bufferCreateInfo.sType != local_1d8._0_4_) goto LAB_004c489d;
                uVar14 = 0xffffffffffffffff;
                do {
                  if (uVar14 == 2) goto LAB_004c4935;
                  lVar3 = uVar14 * 4;
                  uVar1 = uVar14 + 1;
                  lVar4 = uVar14 * 4;
                  uVar14 = uVar1;
                } while (*(int *)((long)&bufferCreateInfo.pNext + lVar3) ==
                         *(int *)((long)&pDStack_1d0 + lVar4));
                if (uVar1 < 3) goto LAB_004c489d;
LAB_004c4935:
                tcu::PixelBufferAccess::setPixel(&errorMask,&local_238,iVar19,z,0);
              }
              else {
LAB_004c489d:
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&bufferCreateInfo,(int)&referenceImage,iVar19,z
                          );
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_1d8,(int)&actualImage,iVar19,z);
                if (((float)bufferCreateInfo.sType == (float)local_1d8._0_4_) &&
                   (!NAN((float)bufferCreateInfo.sType) && !NAN((float)local_1d8._0_4_))) {
                  uVar14 = 0xffffffffffffffff;
                  do {
                    if (uVar14 == 2) goto LAB_004c4935;
                    fVar6 = *(float *)((long)&bufferCreateInfo.pNext + uVar14 * 4);
                    uVar1 = uVar14 + 1;
                    pfVar5 = (float *)((long)&pDStack_1d0 + uVar14 * 4);
                  } while ((fVar6 == *pfVar5) && (uVar14 = uVar1, !NAN(fVar6) && !NAN(*pfVar5)));
                  if (2 < uVar1) goto LAB_004c4935;
                }
                tcu::PixelBufferAccess::setPixel(&errorMask,&local_248,iVar19,z,0);
                iVar17 = iVar17 + 1;
              }
              iVar19 = iVar19 + 1;
              iVar11 = (caseDef->renderSize).m_data[0];
            } while (iVar19 < iVar11);
            iVar19 = (caseDef->renderSize).m_data[1];
          }
          z = z + 1;
        } while (z < iVar19);
      }
      iVar19 = (int)pTVar12;
      if (local_69c < iVar17) {
        tcu::LogImageSet::LogImageSet(&local_690,&imageName,&imageName);
        tcu::TestLog::startImageSet
                  (pTVar12,local_690.m_name._M_dataplus._M_p,
                   local_690.m_description._M_dataplus._M_p);
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        local_580.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_580.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_580._M_string_length = 6;
        local_580.field_2._M_local_buf[6] = '\0';
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        local_5a0.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_5a0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_5a0._M_string_length = 6;
        local_5a0.field_2._M_local_buf[6] = '\0';
        pCVar16 = &actualImage;
        tcu::LogImage::LogImage
                  ((LogImage *)&bufferCreateInfo,&local_580,&local_5a0,pCVar16,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&bufferCreateInfo,iVar19,__buf,(size_t)pCVar16);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        local_5c0.field_2._M_local_buf[8] = 'e';
        local_5c0.field_2._M_allocated_capacity = 0x636e657265666552;
        local_5c0._M_string_length = 9;
        local_5c0.field_2._M_local_buf[9] = '\0';
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        local_5e0.field_2._M_local_buf[8] = 'e';
        local_5e0.field_2._M_allocated_capacity = 0x636e657265666552;
        local_5e0._M_string_length = 9;
        local_5e0.field_2._M_local_buf[9] = '\0';
        pCVar16 = &referenceImage;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1d8,&local_5c0,&local_5e0,pCVar16,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1d8,iVar19,__buf_00,(size_t)pCVar16);
        local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
        local_600.field_2._M_allocated_capacity = 0x73614d726f727245;
        local_600.field_2._M_local_buf[8] = 'k';
        local_600._M_string_length = 9;
        local_600.field_2._M_local_buf[9] = '\0';
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        local_620.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_620.field_2._8_2_ = 0x6b73;
        local_620._M_string_length = 10;
        local_620.field_2._M_local_buf[10] = '\0';
        pCVar16 = &errorMask.super_ConstPixelBufferAccess;
        tcu::LogImage::LogImage
                  (&local_4f8,&local_600,&local_620,pCVar16,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_4f8,iVar19,__buf_01,(size_t)pCVar16);
        tcu::TestLog::endImageSet(pTVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8.m_description._M_dataplus._M_p != &local_4f8.m_description.field_2) {
          operator_delete(local_4f8.m_description._M_dataplus._M_p,
                          local_4f8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
          operator_delete(local_4f8.m_name._M_dataplus._M_p,
                          CONCAT17(local_4f8.m_name.field_2._M_local_buf[7],
                                   CONCAT16(local_4f8.m_name.field_2._M_local_buf[6],
                                            CONCAT24(local_4f8.m_name.field_2._M_allocated_capacity.
                                                     _4_2_,local_4f8.m_name.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (local_1d8 != (undefined1  [8])&local_1c8) {
          operator_delete((void *)local_1d8,(ulong)(local_1c8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
        }
        if ((deUint32 **)bufferCreateInfo._32_8_ != &bufferCreateInfo.pQueueFamilyIndices) {
          operator_delete((void *)bufferCreateInfo._32_8_,
                          (long)bufferCreateInfo.pQueueFamilyIndices + 1);
        }
        if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
          operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,
                          CONCAT17(local_5a0.field_2._M_local_buf[7],
                                   CONCAT16(local_5a0.field_2._M_local_buf[6],
                                            CONCAT24(local_5a0.field_2._M_allocated_capacity._4_2_,
                                                     local_5a0.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,
                          CONCAT17(local_580.field_2._M_local_buf[7],
                                   CONCAT16(local_580.field_2._M_local_buf[6],
                                            CONCAT24(local_580.field_2._M_allocated_capacity._4_2_,
                                                     local_580.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690.m_description._M_dataplus._M_p != &local_690.m_description.field_2) {
          operator_delete(local_690.m_description._M_dataplus._M_p,
                          local_690.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
          operator_delete(local_690.m_name._M_dataplus._M_p,
                          CONCAT17(local_690.m_name.field_2._M_local_buf[7],
                                   CONCAT16(local_690.m_name.field_2._M_local_buf[6],
                                            CONCAT24(local_690.m_name.field_2._M_allocated_capacity.
                                                     _4_2_,local_690.m_name.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
      }
      else {
        tcu::LogImageSet::LogImageSet((LogImageSet *)local_1d8,&imageName,&imageName);
        tcu::TestLog::startImageSet(pTVar12,(char *)local_1d8,local_1b8._M_p);
        local_4f8.m_name._M_dataplus._M_p = (pointer)&local_4f8.m_name.field_2;
        local_4f8.m_name.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_4f8.m_name.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_4f8.m_name._M_string_length = 6;
        local_4f8.m_name.field_2._M_local_buf[6] = '\0';
        local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
        local_690.m_name.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_690.m_name.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_690.m_name._M_string_length = 6;
        local_690.m_name.field_2._M_local_buf[6] = '\0';
        pCVar16 = &actualImage;
        tcu::LogImage::LogImage
                  ((LogImage *)&bufferCreateInfo,&local_4f8.m_name,&local_690.m_name,pCVar16,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&bufferCreateInfo,iVar19,__buf_02,(size_t)pCVar16);
        tcu::TestLog::endImageSet(pTVar12);
        if ((deUint32 **)bufferCreateInfo._32_8_ != &bufferCreateInfo.pQueueFamilyIndices) {
          operator_delete((void *)bufferCreateInfo._32_8_,
                          (long)bufferCreateInfo.pQueueFamilyIndices + 1);
        }
        if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
          operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
          operator_delete(local_690.m_name._M_dataplus._M_p,
                          CONCAT17(local_690.m_name.field_2._M_local_buf[7],
                                   CONCAT16(local_690.m_name.field_2._M_local_buf[6],
                                            CONCAT24(local_690.m_name.field_2._M_allocated_capacity.
                                                     _4_2_,local_690.m_name.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8.m_name._M_dataplus._M_p != &local_4f8.m_name.field_2) {
          operator_delete(local_4f8.m_name._M_dataplus._M_p,
                          CONCAT17(local_4f8.m_name.field_2._M_local_buf[7],
                                   CONCAT16(local_4f8.m_name.field_2._M_local_buf[6],
                                            CONCAT24(local_4f8.m_name.field_2._M_allocated_capacity.
                                                     _4_2_,local_4f8.m_name.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (local_1d8 != (undefined1  [8])&local_1c8) {
          operator_delete((void *)local_1d8,(ulong)(local_1c8._M_allocated_capacity + 1));
        }
        local_6bc = local_6bc + 1;
      }
      tcu::TextureLevel::~TextureLevel(&errorMaskStorage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)imageName._M_dataplus._M_p != &imageName.field_2) {
        operator_delete(imageName._M_dataplus._M_p,imageName.field_2._M_allocated_capacity + 1);
      }
      iVar18 = iVar18 + 1;
      iVar19 = caseDef->numLayers;
    } while (iVar18 < iVar19);
  }
  bufferCreateInfo._0_8_ = pTVar12;
  if (local_6bc == iVar19) {
    ppvVar2 = &bufferCreateInfo.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppvVar2,"All rendered images are correct.",0x20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&bufferCreateInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
    std::ios_base::~ios_base(local_350);
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  }
  else {
    ppvVar2 = &bufferCreateInfo.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppvVar2,"FAILED: Some rendered images were incorrect.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&bufferCreateInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
    std::ios_base::~ios_base(local_350);
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bufferCreateInfo,"Rendered images are not correct","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  }
  if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
  }
  if (uVar8 != 0) {
    (**(code **)(*(long *)uVar8 + 8))();
  }
  if (resolveBuffer != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_530,(VkBuffer)resolveBuffer);
  }
  if (uVar7 != 0) {
    (**(code **)(*(long *)uVar7 + 8))();
  }
  if (local_518.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_510,local_518);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_STORAGE_BIT);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Host-readable buffer
	const VkDeviceSize				resolveBufferSize			= caseDef.renderSize.x() * caseDef.renderSize.y() * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(caseDef.colorFormat));
	const Unique<VkBuffer>			resolveImageOneBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageOneBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageOneBuffer, MemoryRequirement::HostVisible));
	const Unique<VkBuffer>			resolveImageTwoBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageTwoBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageTwoBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *resolveImageOneBufferAlloc, resolveBufferSize);
	zeroBuffer(vk, device, *resolveImageTwoBufferAlloc, resolveBufferSize);

	// Render: repeat the same rendering twice to avoid non-essential API calls and layout transitions (e.g. copy).
	{
		renderAndResolve(context, caseDef, *resolveImageOneBuffer, false);	// Pass 1: render a basic multisampled image
		renderAndResolve(context, caseDef, *resolveImageTwoBuffer, true);	// Pass 2: the same but altered with a compute shader
	}

	// Verify
	{
		invalidateMappedMemoryRange(vk, device, resolveImageOneBufferAlloc->getMemory(), resolveImageOneBufferAlloc->getOffset(), resolveBufferSize);
		invalidateMappedMemoryRange(vk, device, resolveImageTwoBufferAlloc->getMemory(), resolveImageTwoBufferAlloc->getOffset(), resolveBufferSize);

		const tcu::PixelBufferAccess		layeredImageOne	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageOneBufferAlloc->getHostPtr());
		const tcu::ConstPixelBufferAccess	layeredImageTwo	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageTwoBufferAlloc->getHostPtr());

		// Check all layers
		if (!compareImages(context.getTestContext().getLog(), caseDef, layeredImageOne, layeredImageTwo))
			return tcu::TestStatus::fail("Rendered images are not correct");
	}

	return tcu::TestStatus::pass("OK");
}